

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierBuilder::Export(CQualifierBuilder *this,CQualifier *qualifier)

{
  bool bVar1;
  CQualifier *qualifier_local;
  CQualifierBuilder *this_local;
  
  AddW(this);
  qualifier->flags = 0;
  (qualifier->ansichars).super__Base_bitset<2UL>._M_w[0] =
       (this->ansichars).super__Base_bitset<2UL>._M_w[0];
  (qualifier->ansichars).super__Base_bitset<2UL>._M_w[1] =
       (this->ansichars).super__Base_bitset<2UL>._M_w[1];
  if (this->terms == S_Yes) {
    qualifier->flags = qualifier->flags | 1;
  }
  bVar1 = CSetBuilder<char>::Export(&this->charsBuilder,&qualifier->chars);
  if (bVar1) {
    qualifier->flags = qualifier->flags | 2;
  }
  bVar1 = CSetBuilder<int>::Export(&this->labelsBuilder,&qualifier->labels);
  if (bVar1) {
    qualifier->flags = qualifier->flags | 4;
  }
  bVar1 = CSetBuilder<unsigned_int>::Export(&this->numbersBuilder,&qualifier->numbers);
  if (bVar1) {
    qualifier->flags = qualifier->flags | 8;
  }
  return;
}

Assistant:

void CQualifierBuilder::Export( CQualifier& qualifier )
{
	AddW();
	qualifier.flags = 0;
	qualifier.ansichars = ansichars;
	if( terms == S_Yes ) {
		qualifier.flags |= QIF_Terms;
	}
	if( charsBuilder.Export( qualifier.chars ) ) {
		qualifier.flags |= QIF_AllChars;
	}
	if( labelsBuilder.Export( qualifier.labels ) ) {
		qualifier.flags |= QIF_AllLabels;
	}
	if( numbersBuilder.Export( qualifier.numbers ) ) {
		qualifier.flags |= QIF_AllNumbers;
	}
}